

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O3

unique_ptr<Cryptor,_std::default_delete<Cryptor>_> __thiscall
Cryptor::cryptor_factory(Cryptor *this,string *mode,string *type,string *message)

{
  int iVar1;
  int iVar2;
  runtime_error *prVar3;
  Cryptors type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)mode);
  if (iVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)mode);
    if (iVar2 != 0) {
      std::operator+(&local_48,"Not possible mode: ",mode);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,local_48._M_dataplus._M_p);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    type_00 = Huffman;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      type_00 = Lz77;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)type);
      type_00 = Deflate;
      if (iVar2 != 0) {
        std::operator+(&local_48,"Not possible type: ",type);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,local_48._M_dataplus._M_p);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  cryptor_factory(this,iVar1 == 0,type_00,message);
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const std::string& mode,
  const std::string& type,
  const std::string& message)
{
  bool b_mode;
  Cryptors c_type;

  if (mode == ENCRYPT_KEY) {
    b_mode = true;
  }
  else if (mode == DECRYPT_KEY) {
    b_mode = false;
  }
  else {
    const auto msg = "Not possible mode: " + mode;
    throw runtime_error(msg.c_str());
  }

  if (type == HUFFMAN_KEY) {
    c_type = Cryptors::Huffman;
  }
  else if (type == LZ77_KEY) {
    c_type = Cryptors::Lz77;
  }
  else if (type == DEFLATE_KEY) {
    c_type = Cryptors::Deflate;
  }
  else {
    const auto msg = "Not possible type: " + type;
    throw runtime_error(msg.c_str());
  }

  return cryptor_factory(b_mode, c_type, message);
}